

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<long,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,long input)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  hugeint_t result;
  hugeint_t local_58;
  string local_40;
  
  bVar3 = TryCast::Operation<long,duckdb::hugeint_t>(input,&local_58,false);
  if (bVar3) {
    pdVar1 = col->data;
    iVar2 = (this->chunk).count;
    *(uint64_t *)(pdVar1 + iVar2 * 0x10) = local_58.lower;
    *(int64_t *)((long)(pdVar1 + iVar2 * 0x10) + 8) = local_58.upper;
    return;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,duckdb::hugeint_t>(&local_40,(duckdb *)input,auVar4._8_8_);
  InvalidInputException::InvalidInputException(auVar4._0_8_,&local_40);
  __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}